

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  Vdbe *p;
  sqlite3 *db_00;
  i16 iVar1;
  int iVar2;
  uint p4;
  int iVar3;
  Index *pIVar4;
  SrcList *pTabList;
  int local_64;
  int k;
  int i;
  int iPk;
  int nPk;
  Index *pPk;
  int regRowid;
  int iDataCur;
  SrcList *pSrc;
  sqlite3 *db;
  Vdbe *v;
  int iCur_local;
  Index *pIdx_local;
  Table *pTab_local;
  Upsert *pUpsert_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  db_00 = pParse->db;
  iVar3 = pUpsert->iDataCur;
  if ((pIdx != (Index *)0x0) && (iCur != iVar3)) {
    if ((pTab->tabFlags & 0x20) == 0) {
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x87,iCur,iVar2);
      sqlite3VdbeAddOp3(p,0x1e,iVar3,0,iVar2);
      sqlite3ReleaseTempReg(pParse,iVar2);
    }
    else {
      pIVar4 = sqlite3PrimaryKeyIndex(pTab);
      p4 = (uint)pIVar4->nKeyCol;
      iVar2 = pParse->nMem + 1;
      pParse->nMem = p4 + pParse->nMem;
      for (local_64 = 0; local_64 < (int)p4; local_64 = local_64 + 1) {
        iVar1 = sqlite3ColumnOfIndex(pIdx,pIVar4->aiColumn[local_64]);
        sqlite3VdbeAddOp3(p,0x5a,iCur,(int)iVar1,iVar2 + local_64);
      }
      iVar3 = sqlite3VdbeAddOp4Int(p,0x1d,iVar3,0,iVar2,p4);
      sqlite3VdbeAddOp4(p,0x45,0xb,2,0,"corrupt database",-1);
      sqlite3VdbeJumpHere(p,iVar3);
    }
  }
  pTabList = sqlite3SrcListDup(db_00,pUpsert->pUpsertSrc,0);
  sqlite3Update(pParse,pTabList,pUpsert->pUpsertSet,pUpsert->pUpsertWhere,2,(ExprList *)0x0,
                (Expr *)0x0,pUpsert);
  pUpsert->pUpsertSet = (ExprList *)0x0;
  pUpsert->pUpsertWhere = (Expr *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;

  assert( v!=0 );
  assert( pUpsert!=0 );
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  iDataCur = pUpsert->iDataCur;
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      int i;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0, 
            "corrupt database", P4_STATIC);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pUpsertSrc - the outer INSERT statement does.  So
  ** we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pUpsert->pUpsertSrc, 0);
  sqlite3Update(pParse, pSrc, pUpsert->pUpsertSet,
      pUpsert->pUpsertWhere, OE_Abort, 0, 0, pUpsert);
  pUpsert->pUpsertSet = 0;    /* Will have been deleted by sqlite3Update() */
  pUpsert->pUpsertWhere = 0;  /* Will have been deleted by sqlite3Update() */
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}